

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall
tinyusdz::TypedTimeSamples<std::vector<double,_std::allocator<double>_>_>::add_sample
          (TypedTimeSamples<std::vector<double,_std::allocator<double>_>_> *this,double t,
          vector<double,_std::allocator<double>_> *v)

{
  undefined1 local_48 [8];
  Sample s;
  vector<double,_std::allocator<double>_> *v_local;
  double t_local;
  TypedTimeSamples<std::vector<double,_std::allocator<double>_>_> *this_local;
  
  s._32_8_ = v;
  Sample::Sample((Sample *)local_48);
  local_48 = (undefined1  [8])t;
  ::std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)&s,
             (vector<double,_std::allocator<double>_> *)s._32_8_);
  ::std::
  vector<tinyusdz::TypedTimeSamples<std::vector<double,std::allocator<double>>>::Sample,std::allocator<tinyusdz::TypedTimeSamples<std::vector<double,std::allocator<double>>>::Sample>>
  ::emplace_back<tinyusdz::TypedTimeSamples<std::vector<double,std::allocator<double>>>::Sample&>
            ((vector<tinyusdz::TypedTimeSamples<std::vector<double,std::allocator<double>>>::Sample,std::allocator<tinyusdz::TypedTimeSamples<std::vector<double,std::allocator<double>>>::Sample>>
              *)this,(Sample *)local_48);
  this->_dirty = true;
  Sample::~Sample((Sample *)local_48);
  return;
}

Assistant:

void add_sample(const double t, const T &v) {
    Sample s;
    s.t = t;
    s.value = v;
    _samples.emplace_back(s);
    _dirty = true;
  }